

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors
          (MessageGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  undefined1 auVar1 [8];
  bool bVar2;
  ArenaDtorNeeds AVar3;
  FileDescriptor *file;
  Options *in_RCX;
  Sub *local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  undefined1 local_241;
  anon_class_16_2_fd512ddd_for_cb local_240;
  allocator<char> local_229;
  string local_228;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  Sub *local_1b0;
  Sub local_1a8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  MessageGenerator *this_local;
  
  local_241 = 1;
  local_1b0 = &local_1a8;
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"superclass",&local_1d1);
  SuperClassName_abi_cxx11_
            (&local_208,(cpp *)this->descriptor_,(Descriptor *)&this->options_,in_RCX);
  io::Printer::Sub::Sub<std::__cxx11::string>(&local_1a8,&local_1d0,&local_208);
  local_1b0 = &local_f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"ctor_body",&local_229);
  local_240.p = (Printer **)local_18;
  local_240.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::MessageGenerator::GenerateStructors(google::protobuf::io::Printer*)::__0>
            (&local_f0,&local_228,&local_240);
  local_241 = 0;
  local_38 = &local_1a8;
  local_30 = 2;
  v._M_len = 2;
  v._M_array = local_38;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_258,
             "\n        $classname$::$classname$(::$proto_ns$::Arena* arena)\n#if defined(PROTOBUF_CUSTOM_VTABLE)\n            : $superclass$(arena, _class_data_.base()) {\n#else   // PROTOBUF_CUSTOM_VTABLE\n            : $superclass$(arena) {\n#endif  // PROTOBUF_CUSTOM_VTABLE\n          $ctor_body$;\n          // @@protoc_insertion_point(arena_constructor:$full_name$)\n        }\n      "
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (p,local_28._M_allocated_capacity,local_28._8_8_,local_258._M_len,local_258._M_str);
  local_2d8 = (Sub *)&local_38;
  do {
    local_2d8 = local_2d8 + -1;
    io::Printer::Sub::~Sub(local_2d8);
  } while (local_2d8 != &local_1a8);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  file = Descriptor::file(this->descriptor_);
  bVar2 = UsingImplicitWeakFields(file,&this->options_);
  auVar1 = local_18;
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_270,
               "\n      $classname$::$classname$(\n          //~ Force alignment\n          ::$proto_ns$::Arena* arena, const $classname$& from)\n          : $classname$(arena) {\n        MergeFrom(from);\n      }\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_270._M_len,local_270._M_str);
  }
  else {
    bVar2 = ImplHasCopyCtor(this);
    auVar1 = local_18;
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_288,
                 "\n      $classname$::$classname$(\n          //~ Force alignment\n          ::$proto_ns$::Arena* arena, const $classname$& from)\n          : $classname$(arena) {\n        MergeFrom(from);\n      }\n    "
                );
      io::Printer::SourceLocation::current();
      io::Printer::Emit((Printer *)auVar1,local_288._M_len,local_288._M_str);
    }
    else {
      GenerateArenaEnabledCopyConstructor(this,(Printer *)local_18);
    }
  }
  GenerateSharedConstructorCode(this,(Printer *)local_18);
  bVar2 = HasSimpleBaseClass(this->descriptor_,&this->options_);
  auVar1 = local_18;
  if (!bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a0,
               "\n          $classname$::~$classname$() {\n            // @@protoc_insertion_point(destructor:$full_name$)\n            SharedDtor(*this);\n          }\n        "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_2a0._M_len,local_2a0._M_str);
  }
  GenerateSharedDestructorCode(this,(Printer *)local_18);
  AVar3 = NeedsArenaDestructor(this);
  if (0 < (int)AVar3) {
    GenerateArenaDestructorCode(this,(Printer *)local_18);
  }
  return;
}

Assistant:

void MessageGenerator::GenerateStructors(io::Printer* p) {
  p->Emit(
      {
          {"superclass", SuperClassName(descriptor_, options_)},
          {"ctor_body",
           [&] {
             if (HasSimpleBaseClass(descriptor_, options_)) return;
             p->Emit(R"cc(SharedCtor(arena);)cc");
             switch (NeedsArenaDestructor()) {
               case ArenaDtorNeeds::kRequired: {
                 p->Emit(R"cc(
                   if (arena != nullptr) {
                     arena->OwnCustomDestructor(this, &$classname$::ArenaDtor);
                   }
                 )cc");
                 break;
               }
               case ArenaDtorNeeds::kOnDemand: {
                 p->Emit(R"cc(
                   ::_pbi::InternalRegisterArenaDtor(arena, this,
                                                     &$classname$::ArenaDtor);
                 )cc");
                 break;
               }
               case ArenaDtorNeeds::kNone:
                 break;
             }
           }},
      },
      R"cc(
        $classname$::$classname$(::$proto_ns$::Arena* arena)
#if defined(PROTOBUF_CUSTOM_VTABLE)
            : $superclass$(arena, _class_data_.base()) {
#else   // PROTOBUF_CUSTOM_VTABLE
            : $superclass$(arena) {
#endif  // PROTOBUF_CUSTOM_VTABLE
          $ctor_body$;
          // @@protoc_insertion_point(arena_constructor:$full_name$)
        }
      )cc");

  // Generate the copy constructor.
  if (UsingImplicitWeakFields(descriptor_->file(), options_)) {
    // If we are in lite mode and using implicit weak fields, we generate a
    // one-liner copy constructor that delegates to MergeFrom. This saves some
    // code size and also cuts down on the complexity of implicit weak fields.
    // We might eventually want to do this for all lite protos.
    p->Emit(R"cc(
      $classname$::$classname$(
          //~ Force alignment
          ::$proto_ns$::Arena* arena, const $classname$& from)
          : $classname$(arena) {
        MergeFrom(from);
      }
    )cc");
  } else if (ImplHasCopyCtor()) {
    p->Emit(R"cc(
      $classname$::$classname$(
          //~ Force alignment
          ::$proto_ns$::Arena* arena, const $classname$& from)
          : $classname$(arena) {
        MergeFrom(from);
      }
    )cc");
  } else {
    GenerateArenaEnabledCopyConstructor(p);
  }

  // Generate the shared constructor code.
  GenerateSharedConstructorCode(p);

  // Generate the destructor.
  if (HasSimpleBaseClass(descriptor_, options_)) {
    // For messages using simple base classes, having no destructor
    // allows our vtable to share the same destructor as every other
    // message with a simple base class.  This works only as long as
    // we have no fields needing destruction, of course.  (No strings
    // or extensions)
  } else {
    p->Emit(
        R"cc(
          $classname$::~$classname$() {
            // @@protoc_insertion_point(destructor:$full_name$)
            SharedDtor(*this);
          }
        )cc");
  }

  // Generate the shared destructor code.
  GenerateSharedDestructorCode(p);

  // Generate the arena-specific destructor code.
  if (NeedsArenaDestructor() > ArenaDtorNeeds::kNone) {
    GenerateArenaDestructorCode(p);
  }
}